

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.h
# Opt level: O0

void __thiscall
AggressiveBotStrategy::AggressiveBotStrategy(AggressiveBotStrategy *this,Player *player)

{
  string *this_00;
  allocator<char> local_25 [13];
  Player *local_18;
  Player *player_local;
  AggressiveBotStrategy *this_local;
  
  local_18 = player;
  player_local = (Player *)this;
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy,player);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_001698a8;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"AGGRESSIVE",local_25);
  (this->super_PlayerStrategy).strategyName = this_00;
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

explicit AggressiveBotStrategy(Player* player): PlayerStrategy(player) { this->strategyName = new std::string("AGGRESSIVE"); }